

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O2

void SubPointFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  value_type vVar1;
  value_type vVar2;
  long lVar3;
  long lVar4;
  reference pvVar5;
  reference pvVar6;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  reference this_02;
  reference this_03;
  reference this_04;
  type pVVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t col;
  ulong __n;
  int iVar11;
  ulong local_f0;
  UnifiedVectorFormat rhs_data;
  long local_b0;
  UnifiedVectorFormat lhs_data;
  long local_68;
  
  pvVar5 = duckdb::vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  pvVar6 = duckdb::vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  uVar9 = *(ulong *)(args + 0x18);
  vVar1 = *pvVar5;
  vVar2 = *pvVar6;
  duckdb::DataChunk::Flatten();
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&lhs_data);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&rhs_data);
  iVar11 = (int)uVar9;
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar5,(UnifiedVectorFormat *)(long)iVar11);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar6,(UnifiedVectorFormat *)(long)iVar11);
  duckdb::Vector::SetVectorType((VectorType)result);
  this = (vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
          *)duckdb::StructVector::GetEntries(result);
  this_00 = (vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             *)duckdb::StructVector::GetEntries(pvVar5);
  this_01 = (vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             *)duckdb::StructVector::GetEntries(pvVar6);
  uVar8 = 0;
  uVar9 = uVar9 & 0xffffffff;
  if (iVar11 < 1) {
    uVar9 = uVar8;
  }
  for (; uVar8 != uVar9; uVar8 = uVar8 + 1) {
    local_f0 = uVar8;
    if (*_lhs_data != 0) {
      local_f0 = (ulong)*(uint *)(*_lhs_data + uVar8 * 4);
    }
    uVar10 = uVar8;
    if (*_rhs_data != 0) {
      uVar10 = (ulong)*(uint *)(*_rhs_data + uVar8 * 4);
    }
    if (((local_68 == 0) ||
        ((*(ulong *)(local_68 + (local_f0 >> 6) * 8) >> (local_f0 & 0x3f) & 1) != 0)) &&
       ((local_b0 == 0 || ((*(ulong *)(local_b0 + (uVar10 >> 6) * 8) >> (uVar10 & 0x3f) & 1) != 0)))
       ) {
      for (__n = 0; __n < (ulong)(*(long *)(this + 8) - *(long *)this >> 3); __n = __n + 1) {
        this_02 = duckdb::
                  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this,__n);
        this_03 = duckdb::
                  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this_00,__n);
        this_04 = duckdb::
                  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this_01,__n);
        pVVar7 = duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                 operator*(this_02);
        lVar3 = *(long *)(pVVar7 + 0x20);
        pVVar7 = duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                 operator*(this_03);
        lVar4 = *(long *)(pVVar7 + 0x20);
        pVVar7 = duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                 operator*(this_04);
        *(int *)(lVar3 + uVar8 * 4) =
             *(int *)(lVar4 + local_f0 * 4) - *(int *)(*(long *)(pVVar7 + 0x20) + uVar10 * 4);
      }
    }
    else {
      duckdb::FlatVector::SetNull(result,uVar8,true);
    }
  }
  if ((vVar1 == (value_type)0x2) && (vVar2 == (value_type)0x2)) {
    duckdb::Vector::SetVectorType((VectorType)result);
  }
  duckdb::Vector::Verify((ulong)result);
  duckdb::UnifiedVectorFormat::~UnifiedVectorFormat(&rhs_data);
  duckdb::UnifiedVectorFormat::~UnifiedVectorFormat(&lhs_data);
  return;
}

Assistant:

inline void SubPointFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &left_vector = args.data[0];
	auto &right_vector = args.data[1];
	const int count = args.size();
	auto left_vector_type = left_vector.GetVectorType();
	auto right_vector_type = right_vector.GetVectorType();

	args.Flatten();
	UnifiedVectorFormat lhs_data;
	UnifiedVectorFormat rhs_data;
	left_vector.ToUnifiedFormat(count, lhs_data);
	right_vector.ToUnifiedFormat(count, rhs_data);

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto &child_entries = StructVector::GetEntries(result);
	auto &left_child_entries = StructVector::GetEntries(left_vector);
	auto &right_child_entries = StructVector::GetEntries(right_vector);
	for (int base_idx = 0; base_idx < count; base_idx++) {
		auto lhs_list_index = lhs_data.sel->get_index(base_idx);
		auto rhs_list_index = rhs_data.sel->get_index(base_idx);
		if (!lhs_data.validity.RowIsValid(lhs_list_index) || !rhs_data.validity.RowIsValid(rhs_list_index)) {
			FlatVector::SetNull(result, base_idx, true);
			continue;
		}
		for (size_t col = 0; col < child_entries.size(); ++col) {
			auto &child_entry = child_entries[col];
			auto &left_child_entry = left_child_entries[col];
			auto &right_child_entry = right_child_entries[col];
			auto pdata = ConstantVector::GetData<int32_t>(*child_entry);
			auto left_pdata = ConstantVector::GetData<int32_t>(*left_child_entry);
			auto right_pdata = ConstantVector::GetData<int32_t>(*right_child_entry);
			pdata[base_idx] = left_pdata[lhs_list_index] - right_pdata[rhs_list_index];
		}
	}
	if (left_vector_type == VectorType::CONSTANT_VECTOR && right_vector_type == VectorType::CONSTANT_VECTOR) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	result.Verify(count);
}